

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O1

bool __thiscall
pg::TLSolver::attractTangle(TLSolver *this,int t,int pl,bitset *R,bitset *Z,int maxpr)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  pointer puVar4;
  uint64_t *puVar5;
  ulong uVar6;
  bool bVar7;
  ostream *poVar8;
  ulong uVar9;
  uint *puVar10;
  int *piVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint *puVar15;
  uint uVar16;
  _label_vertex local_40;
  
  piVar3 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar16 = piVar3[t];
  if ((uVar16 & 1) == pl && ((int)uVar16 <= maxpr && uVar16 != 0xffffffff)) {
    puVar4 = (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = puVar4[t];
    if (uVar16 == 0) {
      piVar11 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start[t];
      iVar14 = *piVar11;
      if (iVar14 == -1) {
        uVar16 = 0;
      }
      else {
        uVar16 = 0;
        do {
          piVar11 = piVar11 + 1;
          uVar16 = uVar16 + (((this->G)._bits[(ulong)(long)iVar14 >> 6] >> ((long)iVar14 & 0x3fU) &
                             1) != 0);
          iVar14 = *piVar11;
        } while (iVar14 != -1);
      }
    }
    puVar4[t] = uVar16 - 1;
    if ((int)uVar16 < 2) {
      puVar5 = (this->G)._bits;
      puVar15 = (uint *)(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                        super__Vector_impl_data._M_start[t];
      puVar10 = puVar15;
      do {
        uVar13 = (ulong)(int)*puVar10;
        if (uVar13 == 0xffffffffffffffff) {
          puVar10 = puVar10 + 1;
          iVar14 = 4;
LAB_0016ae6d:
          bVar7 = false;
        }
        else {
          puVar10 = puVar10 + 2;
          if ((puVar5[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
            piVar3[t] = -1;
            iVar14 = 1;
            goto LAB_0016ae6d;
          }
          iVar14 = 0;
          bVar7 = true;
        }
      } while (iVar14 == 0);
      if ((iVar14 == 4) || (bVar7)) {
        if (maxpr == 0x7fffffff) {
          piVar3[t] = -1;
        }
        do {
          uVar1 = *puVar15;
          uVar13 = (ulong)(int)uVar1;
          if (uVar13 == 0xffffffffffffffff) {
            puVar10 = puVar15 + 1;
          }
          else {
            puVar10 = puVar15 + 2;
            uVar9 = uVar13 >> 6;
            uVar6 = Z->_bits[uVar9];
            if (((uVar6 >> (uVar13 & 0x3f) & 1) == 0) &&
               (uVar12 = 1L << (uVar13 & 0x3f), (R->_bits[uVar9] & uVar12) != 0)) {
              uVar2 = puVar15[1];
              Z->_bits[uVar9] = uVar6 | uVar12;
              this->str[uVar13] = uVar2;
              iVar14 = (this->Q).pointer;
              (this->Q).pointer = iVar14 + 1;
              (this->Q).queue[iVar14] = uVar1;
              if (2 < (this->super_Solver).trace) {
                poVar8 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\x1b[1;37mattracted \x1b[36m",0x16);
                local_40.g = (this->super_Solver).game;
                local_40.v = uVar1;
                poVar8 = operator<<(poVar8,&local_40);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,"\x1b[m by \x1b[1;36m",0xe);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,pl);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m",3);
                poVar8 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," (via tangle ",0xd);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,t);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
                std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
                std::ostream::put((char)poVar8);
                std::ostream::flush();
              }
            }
          }
          puVar15 = puVar10;
        } while (uVar1 != 0xffffffff);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
TLSolver::attractTangle(const int t, const int pl, bitset &R, bitset &Z, int maxpr)
{
    /**
     * Check if tangle is won by player <pl> and not deleted.
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (tangle_pr > maxpr) return false; // too high...
        if (pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if the tangle can escape to R\Z.
     */
    {
        int e = tescs[t];
        if (e == 0) {
            int v, *ptr = tout[t];
            while ((v=*ptr++) != -1) {
                if (G[v]) e++;
            }
        }
        tescs[t] = --e;
        if (e > 0) return false;
    }

    /**
     * On-the-fly detect out-of-game tangles
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            }
        }
    }

    if (maxpr == INT_MAX) {
        // attracted to a dominion, so delete the tangle
        tpr[t] = -1;
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            if (!R[v]) continue; // not in <R> (might be higher region)
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}